

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

void __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_0U>::clear
          (IntervalMap<unsigned_long,_std::monostate,_0U> *this,allocator_type *alloc)

{
  uint uVar1;
  uint32_t uVar2;
  FreeNode *pFVar3;
  FreeNode *pFVar4;
  size_type sVar5;
  ulong uVar6;
  size_type sVar7;
  long lVar8;
  IntervalMap<unsigned_long,_std::monostate,_0U> *args;
  size_t e;
  SmallVector<slang::IntervalMapDetails::NodeRef,_5UL> refs;
  SmallVector<slang::IntervalMapDetails::NodeRef,_5UL> nextRefs;
  SmallVectorBase<slang::IntervalMapDetails::NodeRef> local_b0 [2];
  SmallVectorBase<slang::IntervalMapDetails::NodeRef> local_70 [2];
  
  if (this->height != 0) {
    local_b0[0].data_ = (pointer)local_b0[0].firstElement;
    local_b0[0].len = 0;
    local_b0[0].cap = 5;
    local_70[0].data_ = (pointer)local_70[0].firstElement;
    local_70[0].len = 0;
    local_70[0].cap = 5;
    if (this->rootSize != 0) {
      uVar6 = 0;
      args = this;
      do {
        SmallVectorBase<slang::IntervalMapDetails::NodeRef>::
        emplace_back<slang::IntervalMapDetails::NodeRef_const&>(local_b0,(NodeRef *)args);
        uVar6 = uVar6 + 1;
        args = (IntervalMap<unsigned_long,_std::monostate,_0U> *)
               &(args->field_0).rootLeaf.
                super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_11U>
                .first[0].right;
      } while (uVar6 < this->rootSize);
    }
    uVar2 = this->height;
    while( true ) {
      sVar5 = local_b0[0].len;
      uVar2 = uVar2 - 1;
      if (uVar2 == 0) break;
      if (local_b0[0].len != 0) {
        sVar7 = 0;
        do {
          uVar1 = *(uint *)((long)local_b0[0].data_ + sVar7 * 8);
          lVar8 = 0;
          do {
            SmallVectorBase<slang::IntervalMapDetails::NodeRef>::
            emplace_back<slang::IntervalMapDetails::NodeRef_const&>
                      (local_70,(NodeRef *)
                                ((*(ulong *)((long)local_b0[0].data_ + sVar7 * 8) &
                                 0xffffffffffffffc0) + lVar8));
            lVar8 = lVar8 + 8;
          } while ((ulong)(uVar1 & 0x3f) * 8 + 8 != lVar8);
          uVar6 = *(ulong *)((long)local_b0[0].data_ + sVar7 * 8);
          ((FreeNode *)(uVar6 & 0xffffffffffffffc0))->next = alloc->freeList;
          alloc->freeList = (FreeNode *)(uVar6 & 0xffffffffffffffc0);
          sVar7 = sVar7 + 1;
        } while (sVar7 != sVar5);
      }
      local_b0[0].len = 0;
      SmallVectorBase<slang::IntervalMapDetails::NodeRef>::swap(local_b0,local_70);
    }
    if (local_b0[0].len != 0) {
      sVar5 = 0;
      pFVar3 = alloc->freeList;
      do {
        pFVar4 = (FreeNode *)(*(ulong *)((long)local_b0[0].data_ + sVar5 * 8) & 0xffffffffffffffc0);
        pFVar4->next = pFVar3;
        sVar5 = sVar5 + 1;
        pFVar3 = pFVar4;
      } while (local_b0[0].len != sVar5);
      alloc->freeList = pFVar4;
    }
    memset(this,0,0xc4);
    if (local_70[0].data_ != (pointer)local_70[0].firstElement) {
      operator_delete(local_70[0].data_);
    }
    if (local_b0[0].data_ != (pointer)local_b0[0].firstElement) {
      operator_delete(local_b0[0].data_);
    }
  }
  this->rootSize = 0;
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::clear(allocator_type& alloc) {
    using namespace IntervalMapDetails;
    if (!isFlat()) {
        // Collect level 0 nodes from the root.
        SmallVector<NodeRef> refs, nextRefs;
        for (uint32_t i = 0; i < rootSize; i++)
            refs.push_back(rootBranch.childAt(i));

        // Visit all branch nodes.
        for (uint32_t h = height - 1; h > 0; h--) {
            for (size_t i = 0, e = refs.size(); i != e; i++) {
                for (size_t j = 0, s = refs[i].size(); j != s; j++)
                    nextRefs.push_back(refs[i].childAt(uint32_t(j)));

                alloc.destroy(&refs[i].get<Branch>());
            }

            refs.clear();
            refs.swap(nextRefs);
        }

        // Visit all leaf nodes.
        for (size_t i = 0, e = refs.size(); i != e; i++)
            alloc.destroy(&refs[i].get<Leaf>());

        switchToLeaf();
    }
    rootSize = 0;
}